

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_obj.h
# Opt level: O2

unsigned_long file_size(void *file,void *user_data)

{
  long __off;
  unsigned_long uVar1;
  
  __off = ftell((FILE *)file);
  fseek((FILE *)file,0,2);
  uVar1 = ftell((FILE *)file);
  fseek((FILE *)file,__off,0);
  if ((long)uVar1 < 1) {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static
unsigned long file_size(void* file, void* user_data)
{
   FILE* f;
   long p;
   long n;
   (void)(user_data);
   
   f = (FILE*)(file);

   p = ftell(f);
   fseek(f, 0, SEEK_END);
   n = ftell(f);
   fseek(f, p, SEEK_SET);

   if (n > 0)
       return (unsigned long)(n);
   else
       return 0;
}